

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void cleanup_dun_data(dun_data *dd)

{
  int local_14;
  wchar_t i;
  dun_data *dd_local;
  
  cave_connectors_free(dun->join);
  cave_connectors_free(dun->one_off_above);
  cave_connectors_free(dun->one_off_below);
  mem_free(dun->cent);
  mem_free(dun->ent_n);
  for (local_14 = 0; local_14 < (int)(uint)z_info->level_room_max; local_14 = local_14 + 1) {
    mem_free(dun->ent[local_14]);
  }
  mem_free(dun->ent);
  if (dun->ent2room != (int **)0x0) {
    for (local_14 = 0; dun->ent2room[local_14] != (int *)0x0; local_14 = local_14 + 1) {
      mem_free(dun->ent2room[local_14]);
    }
    mem_free(dun->ent2room);
  }
  mem_free(dun->door);
  mem_free(dun->wall);
  mem_free(dun->tunn);
  return;
}

Assistant:

static void cleanup_dun_data(struct dun_data *dd)
{
	int i;

	cave_connectors_free(dun->join);
	cave_connectors_free(dun->one_off_above);
	cave_connectors_free(dun->one_off_below);
	mem_free(dun->cent);
	mem_free(dun->ent_n);
	for (i = 0; i < z_info->level_room_max; ++i) {
		mem_free(dun->ent[i]);
	}
	mem_free(dun->ent);
	if (dun->ent2room) {
		for (i = 0; dun->ent2room[i]; ++i) {
			mem_free(dun->ent2room[i]);
		}
		mem_free(dun->ent2room);
	}
	mem_free(dun->door);
	mem_free(dun->wall);
	mem_free(dun->tunn);
}